

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O1

bool __thiscall
cinatra::coro_http_client::add_str_part(coro_http_client *this,string *name,string *content)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  byte extraout_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  size_type *local_58;
  multipart_t *local_50;
  size_type local_48;
  undefined8 uStack_40;
  size_type local_38;
  
  sVar2 = content->_M_string_length;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  local_58 = (size_type *)(content->_M_dataplus)._M_p;
  paVar1 = &content->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58 == paVar1) {
    local_48 = paVar1->_M_allocated_capacity;
    uStack_40 = *(undefined8 *)((long)&content->field_2 + 8);
    local_58 = &local_48;
  }
  else {
    local_48 = paVar1->_M_allocated_capacity;
  }
  local_50 = (multipart_t *)content->_M_string_length;
  (content->_M_dataplus)._M_p = (pointer)paVar1;
  content->_M_string_length = 0;
  (content->field_2)._M_local_buf[0] = '\0';
  local_38 = sVar2;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cinatra::multipart_t>,std::_Select1st<std::pair<std::__cxx11::string_const,cinatra::multipart_t>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cinatra::multipart_t>>>
  ::_M_emplace_unique<std::__cxx11::string,cinatra::multipart_t>
            ((pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::multipart_t>_>,_bool>
              *)&this->form_data_,name,&local_78,local_50);
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return (bool)(extraout_DL & 1);
}

Assistant:

bool add_str_part(std::string name, std::string content) {
    size_t size = content.size();
    return form_data_
        .emplace(std::move(name), multipart_t{"", std::move(content), size})
        .second;
  }